

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O0

int http_write_header(HTTP_INFO *hi)

{
  int iVar1;
  int iVar2;
  int local_1220;
  int l;
  int len;
  int ret;
  char buf [512];
  char request [4096];
  HTTP_INFO *hi_local;
  
  if (hi == (HTTP_INFO *)0x0) {
    hi_local._4_4_ = -1;
  }
  else {
    local_1220 = snprintf(buf + 0x1f8,0x400,
                          "%s %s HTTP/1.1\r\nUser-Agent: Mozilla/5.0 (X11; Linux x86_64) AppleWebKit/537.36 (KHTML, like Gecko) Ubuntu Chromium/49.0.2623.108 Chrome/49.0.2623.108 Safari/537.36\r\nHost: %s:%s\r\nContent-Type: %s\r\n"
                          ,&hi->request,(hi->url).path,(hi->url).host,(hi->url).port,
                          (hi->request).content_type);
    if ((hi->request).referrer[0] != '\0') {
      iVar1 = snprintf(buf + (long)local_1220 + 0x1f8,0x200,"Referer: %s\r\n",(hi->request).referrer
                      );
      local_1220 = iVar1 + local_1220;
    }
    if ((hi->request).chunked == '\x01') {
      iVar1 = snprintf(buf + (long)local_1220 + 0x1f8,0x200,"Transfer-Encoding: chunked\r\n");
    }
    else {
      iVar1 = snprintf(buf + (long)local_1220 + 0x1f8,0x200,"Content-Length: %ld\r\n",
                       (hi->request).content_length);
    }
    local_1220 = iVar1 + local_1220;
    if ((hi->request).close == '\x01') {
      iVar1 = snprintf(buf + (long)local_1220 + 0x1f8,0x200,"Connection: close\r\n");
    }
    else {
      iVar1 = snprintf(buf + (long)local_1220 + 0x1f8,0x200,"Connection: Keep-Alive\r\n");
    }
    local_1220 = iVar1 + local_1220;
    if ((hi->request).cookie[0] != '\0') {
      iVar1 = snprintf(buf + (long)local_1220 + 0x1f8,0x200,"Cookie: %s\r\n",(hi->request).cookie);
      local_1220 = iVar1 + local_1220;
    }
    iVar1 = snprintf(buf + (long)local_1220 + 0x1f8,0x200,"\r\n");
    printf("%s",buf + 0x1f8);
    iVar2 = https_write(hi,buf + 0x1f8,iVar1 + local_1220);
    if (iVar2 == iVar1 + local_1220) {
      hi_local._4_4_ = 0;
    }
    else {
      https_close(hi);
      hi_local._4_4_ = -1;
      _error = iVar2;
    }
  }
  return hi_local._4_4_;
}

Assistant:

int http_write_header(HTTP_INFO *hi)
{
    char        request[4096], buf[H_FIELD_SIZE];
    int         ret, len, l;


    if (NULL == hi) return -1;

    /* Send HTTP request. */
    len = snprintf(request, 1024,
                   "%s %s HTTP/1.1\r\n"
                   "User-Agent: Mozilla/5.0 (X11; Linux x86_64) AppleWebKit/537.36 (KHTML, like Gecko) Ubuntu Chromium/49.0.2623.108 Chrome/49.0.2623.108 Safari/537.36\r\n"
                   "Host: %s:%s\r\n"
                   "Content-Type: %s\r\n",
                   hi->request.method, hi->url.path,
                   hi->url.host, hi->url.port,
                   hi->request.content_type);


    if(hi->request.referrer[0] != 0)
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Referer: %s\r\n", hi->request.referrer);
    }

    if(hi->request.chunked == TRUE)
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Transfer-Encoding: chunked\r\n");
    }
    else
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Content-Length: %ld\r\n", hi->request.content_length);
    }

    if(hi->request.close == TRUE)
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Connection: close\r\n");
    }
    else
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Connection: Keep-Alive\r\n");
    }

    if(hi->request.cookie[0] != 0)
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Cookie: %s\r\n", hi->request.cookie);
    }

    len += snprintf(&request[len], H_FIELD_SIZE, "\r\n");


    printf("%s", request);

    if ((ret = https_write(hi, request, len)) != len)
    {
        https_close(hi);

        _error = ret;

        return -1;
    }

    return 0;
}